

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdi::ControlContainer::ControlContainer(ControlContainer *this,QMdiSubWindow *mdiChild)

{
  QWidget *this_00;
  QWidget *pQVar1;
  QWidget *pQVar2;
  QObject *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_ffffffffffffff38;
  ControlElement<QMdi::ControlLabel> *this_01;
  QObject local_38 [8];
  QObject local_30 [8];
  QIcon local_28;
  QObject local_20 [8];
  QObject local_18 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d17230;
  this_01 = (ControlElement<QMdi::ControlLabel> *)0x0;
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x0,in_stack_ffffffffffffff38);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)this_01,in_stack_ffffffffffffff38);
  QPointer<QMenuBar>::QPointer((QPointer<QMenuBar> *)this_01,in_stack_ffffffffffffff38);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x62bb44);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x62bb57);
  QPointer<QMdiSubWindow>::QPointer<void>
            ((QPointer<QMdiSubWindow> *)this_01,(QMdiSubWindow *)in_stack_ffffffffffffff38);
  this_00 = (QWidget *)operator_new(0x48);
  ControlElement<QMdi::ControllerWidget>::ControlElement
            ((ControlElement<QMdi::ControllerWidget> *)this_01,
             (QMdiSubWindow *)in_stack_ffffffffffffff38);
  QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffff38);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bba5);
  pQVar2 = (QWidget *)&stack0xfffffffffffffff0;
  QObject::connect((QObject *)pQVar2,(char *)pQVar1,(QObject *)"2_q_close()",(char *)in_RSI,0xab1e6e
                  );
  QMetaObject::Connection::~Connection((Connection *)pQVar2);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bbee);
  QObject::connect(local_18,(char *)pQVar1,(QObject *)"2_q_restore()",(char *)in_RSI,0xb1fc33);
  QMetaObject::Connection::~Connection((Connection *)local_18);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bc32);
  QObject::connect(local_20,(char *)pQVar1,(QObject *)"2_q_minimize()",(char *)in_RSI,0xb1fc50);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  operator_new(0x58);
  ControlElement<QMdi::ControlLabel>::ControlElement
            (this_01,(QMdiSubWindow *)in_stack_ffffffffffffff38);
  QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffff38);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62bca4);
  QWidget::windowIcon(pQVar2);
  QWidget::setWindowIcon(this_00,(QIcon *)in_RDI);
  QIcon::~QIcon(&local_28);
  pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bce6);
  QObject::connect(local_30,(char *)pQVar2,(QObject *)"2_q_clicked()",(char *)in_RSI,0xb1fc6f);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bd2a);
  QObject::connect(local_38,(char *)pQVar2,(QObject *)"2_q_doubleClicked()",(char *)in_RSI,0xab1e6e)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlContainer::ControlContainer(QMdiSubWindow *mdiChild)
    : QObject(mdiChild),
      previousLeft(nullptr),
      previousRight(nullptr),
#if QT_CONFIG(menubar)
      m_menuBar(nullptr),
#endif
      mdiChild(mdiChild)
{
    Q_ASSERT(mdiChild);

    m_controllerWidget = new ControlElement<ControllerWidget>(mdiChild);
    connect(m_controllerWidget, SIGNAL(_q_close()), mdiChild, SLOT(close()));
    connect(m_controllerWidget, SIGNAL(_q_restore()), mdiChild, SLOT(showNormal()));
    connect(m_controllerWidget, SIGNAL(_q_minimize()), mdiChild, SLOT(showMinimized()));

    m_menuLabel = new ControlElement<ControlLabel>(mdiChild);
    m_menuLabel->setWindowIcon(mdiChild->windowIcon());
#if QT_CONFIG(menu)
    connect(m_menuLabel, SIGNAL(_q_clicked()), mdiChild, SLOT(showSystemMenu()));
#endif
    connect(m_menuLabel, SIGNAL(_q_doubleClicked()), mdiChild, SLOT(close()));
}